

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::DirectStateAccess::Buffers::DataTest::iterate(DataTest *this)

{
  PFNGLNAMEDBUFFERDATA p_Var1;
  PFNGLNAMEDBUFFERSUBDATA p_Var2;
  PFNGLNAMEDBUFFERSTORAGE p_Var3;
  PFNGLCOPYNAMEDBUFFERSUBDATA p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ContextType ctxType;
  undefined4 extraout_var;
  undefined4 *puVar10;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  byte bVar11;
  long lVar12;
  undefined1 auVar13 [16];
  long lVar9;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar8);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar6 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar5) || (bVar6)) {
    p_Var1 = *(PFNGLNAMEDBUFFERDATA *)(lVar9 + 0xec0);
    this->m_pNamedBufferData = p_Var1;
    p_Var2 = *(PFNGLNAMEDBUFFERSUBDATA *)(lVar9 + 0xee0);
    this->m_pNamedBufferSubData = p_Var2;
    p_Var3 = *(PFNGLNAMEDBUFFERSTORAGE *)(lVar9 + 0xed8);
    this->m_pNamedBufferStorage = p_Var3;
    p_Var4 = *(PFNGLCOPYNAMEDBUFFERSUBDATA *)(lVar9 + 0x340);
    this->m_pCopyNamedBufferSubData = p_Var4;
    auVar13._0_4_ = -(uint)((int)((ulong)p_Var1 >> 0x20) == 0 && (int)p_Var1 == 0);
    auVar13._4_4_ = -(uint)((int)p_Var2 == 0 && (int)((ulong)p_Var2 >> 0x20) == 0);
    auVar13._8_4_ = -(uint)((int)((ulong)p_Var3 >> 0x20) == 0 && (int)p_Var3 == 0);
    auVar13._12_4_ = -(uint)((int)p_Var4 == 0 && (int)((ulong)p_Var4 >> 0x20) == 0);
    iVar8 = movmskps((int)p_Var1,auVar13);
    if (iVar8 != 0) {
      puVar10 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar10 = 0;
      __cxa_throw(puVar10,&int::typeinfo,0);
    }
    bVar11 = 1;
    lVar12 = 0;
    do {
      bVar5 = TestCase(this,0xa7c466,0);
      bVar6 = TestCase(this,0xa7c4c4,0);
      bVar7 = TestCase(this,0xa7c554,0);
      bVar11 = (bVar6 && bVar7) & bVar11 & bVar5;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x24);
    lVar12 = 0;
    do {
      bVar5 = TestCase(this,0xa7c6d4,0);
      bVar11 = bVar11 & bVar5;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x14);
    do {
      iVar8 = (**(code **)(lVar9 + 0x800))();
    } while (iVar8 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar11 == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DataTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	m_pNamedBufferData		  = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pNamedBufferSubData	 = (PFNGLNAMEDBUFFERSUBDATA)gl.namedBufferSubData;
	m_pNamedBufferStorage	 = (PFNGLNAMEDBUFFERSTORAGE)gl.namedBufferStorage;
	m_pCopyNamedBufferSubData = (PFNGLCOPYNAMEDBUFFERSUBDATA)gl.copyNamedBufferSubData;

	try
	{
		if ((DE_NULL == m_pNamedBufferData) || (DE_NULL == m_pNamedBufferSubData) ||
			(DE_NULL == m_pNamedBufferStorage) || (DE_NULL == m_pCopyNamedBufferSubData))
		{
			throw 0;
		}

		/* BufferData tests */
		static const glw::GLenum hints[] = { GL_STREAM_DRAW,  GL_STREAM_READ,  GL_STREAM_COPY,
											 GL_STATIC_DRAW,  GL_STATIC_READ,  GL_STATIC_COPY,
											 GL_DYNAMIC_DRAW, GL_DYNAMIC_READ, GL_DYNAMIC_COPY };
		static const glw::GLuint hints_count = sizeof(hints) / sizeof(hints[0]);

		for (glw::GLuint i = 0; i < hints_count; ++i)
		{
			is_ok &= TestCase(&DataTest::UploadUsingNamedBufferData, hints[i]);
			is_ok &= TestCase(&DataTest::UploadUsingNamedBufferSubData, hints[i]);
			is_ok &= TestCase(&DataTest::UploadUsingCopyNamedBufferSubData, hints[i]);
		}

		/* BufferStorage Tests */
		static const glw::GLenum bits[] = { GL_MAP_READ_BIT | GL_DYNAMIC_STORAGE_BIT,
											GL_MAP_READ_BIT | GL_MAP_WRITE_BIT, GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT,
											GL_MAP_READ_BIT | GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT,
											GL_MAP_READ_BIT | GL_CLIENT_STORAGE_BIT };
		static const glw::GLuint bits_count = sizeof(bits) / sizeof(bits[0]);

		for (glw::GLuint i = 0; i < bits_count; ++i)
		{
			is_ok &= TestCase(&DataTest::UploadUsingNamedBufferStorage, bits[i]);
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}